

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O3

int recursiveDetectTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  nb_tests = nb_tests + 1;
  lVar2 = xmlNewParserCtxt();
  lVar3 = xmlCtxtReadFile(lVar2,filename,0,6);
  if ((lVar3 == 0) && (*(int *)(lVar2 + 0x25c) == 0x59)) {
    xmlFreeParserCtxt(lVar2);
    iVar1 = 0;
  }
  else {
    fprintf(_stderr,"Failed to detect recursion in %s\n",filename);
    xmlFreeParserCtxt(lVar2);
    xmlFreeDoc(lVar3);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
recursiveDetectTest(const char *filename,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options ATTRIBUTE_UNUSED) {
    xmlDocPtr doc;
    xmlParserCtxtPtr ctxt;
    int res = 0;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    /*
     * base of the test, parse with the old API
     */
    doc = xmlCtxtReadFile(ctxt, filename, NULL,
                          XML_PARSE_NOENT | XML_PARSE_DTDLOAD);
    if ((doc != NULL) || (ctxt->lastError.code != XML_ERR_ENTITY_LOOP)) {
        fprintf(stderr, "Failed to detect recursion in %s\n", filename);
	xmlFreeParserCtxt(ctxt);
	xmlFreeDoc(doc);
        return(1);
    }
    xmlFreeParserCtxt(ctxt);

    return(res);
}